

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

void __thiscall wasm::Outlining::outline(Outlining *this,Module *module,Sequences *seqByFunc)

{
  pointer pOVar1;
  Name name;
  Name name_00;
  mapped_type *pmVar2;
  Function *pFVar3;
  Function *pFVar4;
  undefined1 local_300 [8];
  ReconstructStringifyWalker reconstruct;
  vector<wasm::Name,_std::allocator<wasm::Name>_> keys;
  undefined1 auStack_48 [8];
  Name func;
  
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&reconstruct.func,
             (seqByFunc->_M_h)._M_element_count,(allocator_type *)local_300);
  std::
  transform<std::__detail::_Node_iterator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,false,true>,__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(auto:1)_1_>
            ((seqByFunc->_M_h)._M_before_begin._M_nxt,0,reconstruct.func);
  for (pFVar4 = reconstruct.func;
      pFVar4 != (Function *)
                keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar4 = (Function *)&(pFVar4->super_Importable).super_Named.hasExplicitName) {
    auStack_48 = (undefined1  [8])
                 (pFVar4->super_Importable).super_Named.name.super_IString.str._M_len;
    func.super_IString.str._M_len =
         (size_t)(pFVar4->super_Importable).super_Named.name.super_IString.str._M_str;
    pmVar2 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)seqByFunc,(key_type *)auStack_48);
    pOVar1 = (pmVar2->
             super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pmVar2 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)seqByFunc,(key_type *)auStack_48);
    std::
    __sort<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>>
              (pOVar1,(pmVar2->
                      super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    name.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)auStack_48;
    pFVar3 = Module::getFunction(module,name);
    ReconstructStringifyWalker::ReconstructStringifyWalker
              ((ReconstructStringifyWalker *)local_300,module,pFVar3);
    pmVar2 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)seqByFunc,(key_type *)auStack_48);
    std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::_M_move_assign
              ((vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_> *)
               &reconstruct.state,pmVar2);
    name_00.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_48;
    pFVar3 = Module::getFunction(module,name_00);
    StringifyWalker<wasm::ReconstructStringifyWalker>::doWalkFunction
              ((StringifyWalker<wasm::ReconstructStringifyWalker> *)local_300,pFVar3);
    ReconstructStringifyWalker::~ReconstructStringifyWalker((ReconstructStringifyWalker *)local_300)
    ;
  }
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)&reconstruct.func);
  return;
}

Assistant:

void outline(Module* module,
               Sequences seqByFunc
#if OUTLINING_DEBUG
               ,
               const HashStringifyWalker& stringify
#endif
  ) {
    // TODO: Make this a function-parallel sub-pass.
    std::vector<Name> keys(seqByFunc.size());
    std::transform(seqByFunc.begin(),
                   seqByFunc.end(),
                   keys.begin(),
                   [](auto pair) { return pair.first; });
    for (auto func : keys) {
      // During function reconstruction, a walker iterates thru each instruction
      // of a function, incrementing a counter to find matching sequences. As a
      // result, the sequences of a function must be sorted by
      // smallest start index, otherwise reconstruction will miss outlining a
      // repeat sequence.
      std::sort(seqByFunc[func].begin(),
                seqByFunc[func].end(),
                [](OutliningSequence a, OutliningSequence b) {
                  return a.startIdx < b.startIdx;
                });
      ReconstructStringifyWalker reconstruct(module, module->getFunction(func));
      reconstruct.sequences = std::move(seqByFunc[func]);
      ODBG(printReconstruct(module,
                            stringify.hashString,
                            stringify.exprs,
                            func,
                            reconstruct.sequences));
      reconstruct.doWalkFunction(module->getFunction(func));
    }
  }